

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::tracker_alert::~tracker_alert(tracker_alert *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__tracker_alert_004557e8;
  pcVar3 = (this->url)._M_dataplus._M_p;
  paVar2 = &(this->url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_00455758;
  pcVar3 = (this->super_torrent_alert).name._M_dataplus._M_p;
  paVar2 = &(this->super_torrent_alert).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_alert : torrent_alert
	{
		// internal
		tracker_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, string_view u);

#if TORRENT_ABI_VERSION == 1
		static const int TORRENT_DEPRECATED_MEMBER alert_type = 2;
#endif

		std::string message() const override;

		// endpoint of the listen interface being announced
		aux::noexcept_movable<tcp::endpoint> local_endpoint;

		// returns a 0-terminated string of the tracker's URL
		char const* tracker_url() const;

	private:
		aux::allocation_slot m_url_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// The tracker URL
		std::string TORRENT_DEPRECATED_MEMBER url;
#endif
	}